

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linecontext.cpp
# Opt level: O1

int __thiscall LineContext::init(LineContext *this,EVP_PKEY_CTX *ctx)

{
  Data *pDVar1;
  int *piVar2;
  QArrayData *pQVar3;
  qsizetype qVar4;
  char cVar5;
  int in_EAX;
  QString *data;
  ulong uVar6;
  long lVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QFileInfo info;
  QString ext;
  QFileInfo aQStack_d8 [8];
  QArrayDataPointer<QString> local_d0;
  QArrayData *local_b8;
  QString *pQStack_b0;
  qsizetype local_a8;
  QArrayData *local_a0;
  QString *pQStack_98;
  qsizetype local_90;
  QArrayData *local_88;
  QString *pQStack_80;
  qsizetype local_78;
  QArrayData *local_70;
  QString *pQStack_68;
  qsizetype local_60;
  QArrayDataPointer<QString> local_50;
  QString *local_38;
  qsizetype qStack_30;
  
  if (this->mInit == false) {
    this->mInit = true;
    QFileInfo::QFileInfo(aQStack_d8,(QString *)ctx);
    QVar8.m_data = (storage_type *)0x3;
    QVar8.m_size = (qsizetype)&local_d0;
    QString::fromUtf8(QVar8);
    local_b8 = &(local_d0.d)->super_QArrayData;
    pQStack_b0 = local_d0.ptr;
    local_a8 = local_d0.size;
    QVar9.m_data = (storage_type *)0x3;
    QVar9.m_size = (qsizetype)&local_d0;
    QString::fromUtf8(QVar9);
    local_a0 = &(local_d0.d)->super_QArrayData;
    pQStack_98 = local_d0.ptr;
    local_90 = local_d0.size;
    QVar10.m_data = (storage_type *)0x1;
    QVar10.m_size = (qsizetype)&local_d0;
    QString::fromUtf8(QVar10);
    local_88 = &(local_d0.d)->super_QArrayData;
    pQStack_80 = local_d0.ptr;
    local_78 = local_d0.size;
    QVar11.m_data = (storage_type *)0x3;
    QVar11.m_size = (qsizetype)&local_d0;
    QString::fromUtf8(QVar11);
    local_70 = &(local_d0.d)->super_QArrayData;
    pQStack_68 = local_d0.ptr;
    local_60 = local_d0.size;
    local_50.ptr = (QString *)QArrayData::allocate((QArrayData **)&local_50,0x18,8,4,KeepSize);
    local_50.size = 0;
    uVar6 = 0xffffffffffffffe8;
    do {
      pDVar1 = *(Data **)((long)&local_a0 + uVar6);
      local_50.ptr[local_50.size].d.d = pDVar1;
      local_50.ptr[local_50.size].d.ptr = *(char16_t **)((long)&pQStack_98 + uVar6);
      local_50.ptr[local_50.size].d.size = *(qsizetype *)((long)&local_90 + uVar6);
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_50.size = local_50.size + 1;
      uVar6 = uVar6 + 0x18;
    } while (uVar6 < 0x48);
    lVar7 = 0x48;
    do {
      piVar2 = *(int **)((long)&local_b8 + lVar7);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate(*(QArrayData **)((long)&local_b8 + lVar7),2,8);
        }
      }
      lVar7 = lVar7 + -0x18;
    } while (lVar7 != -0x18);
    QVar12.m_data = (storage_type *)0x2;
    QVar12.m_size = (qsizetype)&local_b8;
    QString::fromUtf8(QVar12);
    pQVar3 = local_b8;
    local_38 = pQStack_b0;
    qStack_30 = local_a8;
    local_d0.ptr = (QString *)QArrayData::allocate((QArrayData **)&local_d0,0x18,8,1,KeepSize);
    ((local_d0.ptr)->d).d = (Data *)pQVar3;
    ((local_d0.ptr)->d).ptr = (char16_t *)local_38;
    ((local_d0.ptr)->d).size = qStack_30;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_d0.size = 1;
    qVar4 = 1;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      qVar4 = local_d0.size;
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        local_d0.size = 1;
        QArrayData::deallocate(pQVar3,2,8);
        qVar4 = local_d0.size;
      }
    }
    local_d0.size = qVar4;
    QFileInfo::suffix();
    QVar13.m_data = (storage_type_conflict *)pQStack_b0;
    QVar13.m_size = local_a8;
    cVar5 = QtPrivate::QStringList_contains((QList *)&local_50,QVar13,CaseSensitive);
    if (cVar5 != '\0') {
      parseCpp(this,(QString *)ctx);
    }
    QVar14.m_data = (storage_type_conflict *)pQStack_b0;
    QVar14.m_size = local_a8;
    cVar5 = QtPrivate::QStringList_contains((QList *)&local_d0,QVar14,CaseSensitive);
    if (cVar5 != '\0') {
      parsePython(this,(QString *)ctx);
    }
    if (local_b8 != (QArrayData *)0x0) {
      LOCK();
      (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b8,2,8);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_d0);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_50);
    in_EAX = QFileInfo::~QFileInfo(aQStack_d8);
  }
  return in_EAX;
}

Assistant:

void LineContext::init(const QString &path)
{
    if (mInit) {
        return;
    }
    mInit = true;

    QFileInfo info(path);

    QStringList cpp = {"cpp", "cxx", "h", "hpp"};
    QStringList py = {"py"};

    QString ext = info.suffix();

    if (cpp.contains(ext)) {
        parseCpp(path);
    }
    if (py.contains(ext)) {
        parsePython(path);
    }
}